

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O0

void __thiscall
t_go_generator::generate_go_struct_equals
          (t_go_generator *this,ostream *out,t_struct *tstruct,string *tstruct_name)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  undefined4 extraout_var;
  members_type *this_00;
  ostream *poVar4;
  reference pptVar5;
  string *psVar6;
  t_type *type;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_248 [8];
  string srcv;
  undefined1 local_208 [8];
  string tgtv;
  t_type *ttype;
  string src;
  string tgt;
  string goType;
  t_type *field_type;
  t_field **local_150;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [8];
  string publicize_field_name;
  string field_name;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string name;
  string *tstruct_name_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_go_generator *this_local;
  
  name.field_2._8_8_ = tstruct_name;
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&fields,(string *)CONCAT44(extraout_var,iVar3));
  this_00 = t_struct::get_sorted_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     *)((long)&field_name.field_2 + 8));
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  poVar4 = std::operator<<(poVar4,"func (p *");
  poVar4 = std::operator<<(poVar4,(string *)name.field_2._8_8_);
  poVar4 = std::operator<<(poVar4,") ");
  poVar4 = std::operator<<(poVar4,(string *)&this->equals_method_name_);
  poVar4 = std::operator<<(poVar4,"(other *");
  poVar4 = std::operator<<(poVar4,(string *)name.field_2._8_8_);
  poVar4 = std::operator<<(poVar4,") bool {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up(&this->super_t_generator);
  std::__cxx11::string::string((string *)(publicize_field_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_a8);
  t_generator::indent_abi_cxx11_(&local_c8,&this->super_t_generator);
  poVar4 = std::operator<<(out,(string *)&local_c8);
  poVar4 = std::operator<<(poVar4,"if p == other {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_c8);
  t_generator::indent_up(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_e8,&this->super_t_generator);
  poVar4 = std::operator<<(out,(string *)&local_e8);
  poVar4 = std::operator<<(poVar4,"return true");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_e8);
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_108,&this->super_t_generator);
  poVar4 = std::operator<<(out,(string *)&local_108);
  poVar4 = std::operator<<(poVar4,"} else if p == nil || other == nil {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_108);
  t_generator::indent_up(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_128,&this->super_t_generator);
  poVar4 = std::operator<<(out,(string *)&local_128);
  poVar4 = std::operator<<(poVar4,"return false");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_128);
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_148,&this->super_t_generator);
  poVar4 = std::operator<<(out,(string *)&local_148);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_148);
  local_150 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
  field_name.field_2._8_8_ = local_150;
  while( true ) {
    field_type = (t_type *)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&field_name.field_2 + 8),
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&field_type);
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&field_name.field_2 + 8));
    psVar6 = t_field::get_name_abi_cxx11_(*pptVar5);
    std::__cxx11::string::operator=
              ((string *)(publicize_field_name.field_2._M_local_buf + 8),(string *)psVar6);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&field_name.field_2 + 8));
    type = t_field::get_type(*pptVar5);
    publicize((string *)((long)&goType.field_2 + 8),this,
              (string *)((long)&publicize_field_name.field_2 + 8),false);
    std::__cxx11::string::operator=((string *)local_a8,(string *)(goType.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(goType.field_2._M_local_buf + 8));
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&field_name.field_2 + 8));
    bVar1 = is_pointer_field(*pptVar5,false);
    type_to_go_type_with_opt_abi_cxx11_((string *)((long)&tgt.field_2 + 8),this,type,bVar1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&src.field_2 + 8),"p.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ttype,
                   "other.",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a8);
    tgtv.field_2._8_8_ = t_type::get_true_type(type);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&field_name.field_2 + 8));
    bVar1 = is_pointer_field(*pptVar5,false);
    if ((bVar1) &&
       (((bVar2 = (**(code **)(*(long *)tgtv.field_2._8_8_ + 0x28))(), (bVar2 & 1) != 0 ||
         (bVar2 = (**(code **)(*(long *)tgtv.field_2._8_8_ + 0x50))(), (bVar2 & 1) != 0)) ||
        (bVar2 = (**(code **)(*(long *)tgtv.field_2._8_8_ + 0x68))(), (bVar2 & 1) != 0)))) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&srcv.field_2 + 8),"(*",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&src.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&srcv.field_2 + 8),")");
      std::__cxx11::string::~string((string *)(srcv.field_2._M_local_buf + 8));
      std::operator+(&local_268,"(*",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ttype);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                     &local_268,")");
      std::__cxx11::string::~string((string *)&local_268);
      t_generator::indent_abi_cxx11_(&local_288,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)&local_288);
      poVar4 = std::operator<<(poVar4,"if ");
      poVar4 = std::operator<<(poVar4,(string *)(src.field_2._M_local_buf + 8));
      poVar4 = std::operator<<(poVar4," != ");
      poVar4 = std::operator<<(poVar4,(string *)&ttype);
      poVar4 = std::operator<<(poVar4," {");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_288);
      t_generator::indent_up(&this->super_t_generator);
      t_generator::indent_abi_cxx11_(&local_2a8,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)&local_2a8);
      poVar4 = std::operator<<(poVar4,"if ");
      poVar4 = std::operator<<(poVar4,(string *)(src.field_2._M_local_buf + 8));
      poVar4 = std::operator<<(poVar4," == nil || ");
      poVar4 = std::operator<<(poVar4,(string *)&ttype);
      poVar4 = std::operator<<(poVar4," == nil {");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2a8);
      t_generator::indent_up(&this->super_t_generator);
      t_generator::indent_abi_cxx11_(&local_2c8,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)&local_2c8);
      poVar4 = std::operator<<(poVar4,"return false");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2c8);
      t_generator::indent_down(&this->super_t_generator);
      t_generator::indent_abi_cxx11_(&local_2e8,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)&local_2e8);
      poVar4 = std::operator<<(poVar4,"}");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::string((string *)&local_308,(string *)local_208);
      std::__cxx11::string::string((string *)&local_328,(string *)local_248);
      generate_go_equals(this,out,type,&local_308,&local_328);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_308);
      t_generator::indent_down(&this->super_t_generator);
      t_generator::indent_abi_cxx11_(&local_348,&this->super_t_generator);
      poVar4 = std::operator<<(out,(string *)&local_348);
      poVar4 = std::operator<<(poVar4,"}");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)local_248);
      std::__cxx11::string::~string((string *)local_208);
    }
    else {
      std::__cxx11::string::string((string *)&local_368,(string *)(src.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&local_388,(string *)&ttype);
      generate_go_equals(this,out,type,&local_368,&local_388);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_368);
    }
    std::__cxx11::string::~string((string *)&ttype);
    std::__cxx11::string::~string((string *)(src.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(tgt.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                *)((long)&field_name.field_2 + 8));
  }
  t_generator::indent_abi_cxx11_(&local_3a8,&this->super_t_generator);
  poVar4 = std::operator<<(out,(string *)&local_3a8);
  poVar4 = std::operator<<(poVar4,"return true");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3a8);
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_3c8,&this->super_t_generator);
  poVar4 = std::operator<<(out,(string *)&local_3c8);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)(publicize_field_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&fields);
  return;
}

Assistant:

void t_go_generator::generate_go_struct_equals(ostream& out,
                                               t_struct* tstruct,
                                               const string& tstruct_name) {
  string name(tstruct->get_name());
  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;
  indent(out) << "func (p *" << tstruct_name << ") " << equals_method_name_ << "(other *"
              << tstruct_name << ") bool {" << endl;
  indent_up();

  string field_name;
  string publicize_field_name;
  out << indent() << "if p == other {" << endl;
  indent_up();
  out << indent() << "return true" << endl;
  indent_down();
  out << indent() << "} else if p == nil || other == nil {" << endl;
  indent_up();
  out << indent() << "return false" << endl;
  indent_down();
  out << indent() << "}" << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    field_name = (*f_iter)->get_name();
    t_type* field_type = (*f_iter)->get_type();
    publicize_field_name = publicize(field_name);
    string goType = type_to_go_type_with_opt(field_type, is_pointer_field(*f_iter));

    string tgt = "p." + publicize_field_name;
    string src = "other." + publicize_field_name;
    t_type* ttype = field_type->get_true_type();
    // Compare field contents
    if (is_pointer_field(*f_iter)
        && (ttype->is_base_type() || ttype->is_enum() || ttype->is_container())) {
      string tgtv = "(*" + tgt + ")";
      string srcv = "(*" + src + ")";
      out << indent() << "if " << tgt << " != " << src << " {" << endl;
      indent_up();
      out << indent() << "if " << tgt << " == nil || " << src << " == nil {" << endl;
      indent_up();
      out << indent() << "return false" << endl;
      indent_down();
      out << indent() << "}" << endl;
      generate_go_equals(out, field_type, tgtv, srcv);
      indent_down();
      out << indent() << "}" << endl;
    } else {
      generate_go_equals(out, field_type, tgt, src);
    }
  }
  out << indent() << "return true" << endl;
  indent_down();
  out << indent() << "}" << endl << endl;
}